

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

int __thiscall CTcTokenizer::look_up_keyword(CTcTokenizer *this,CTcToken *tok,tc_toktyp_t *kwtok)

{
  tc_toktyp_t tVar1;
  CVmHashEntry *this_00;
  tc_toktyp_t *in_RDX;
  CTcToken *in_RSI;
  CTcHashEntryKw *kw;
  size_t in_stack_ffffffffffffffd8;
  uint local_4;
  
  CTcToken::get_text(in_RSI);
  CTcToken::get_text_len(in_RSI);
  this_00 = CVmHashTable::find((CVmHashTable *)in_RSI,(char *)in_RDX,in_stack_ffffffffffffffd8);
  if (this_00 != (CVmHashEntry *)0x0) {
    tVar1 = CTcHashEntryKw::get_tok_id((CTcHashEntryKw *)this_00);
    *in_RDX = tVar1;
  }
  local_4 = (uint)(this_00 != (CVmHashEntry *)0x0);
  return local_4;
}

Assistant:

int CTcTokenizer::look_up_keyword(const CTcToken *tok, tc_toktyp_t *kwtok)
{
    CTcHashEntryKw *kw;

    /* look it up in the keyword table */
    kw = (CTcHashEntryKw *)kw_->find(tok->get_text(), tok->get_text_len());
    if (kw != 0)
    {
        /* we found the keyword - set 'kw' to the keyword token id */
        *kwtok = kw->get_tok_id();

        /* tell the caller we found it */
        return TRUE;
    }
    else
    {
        /* tell the caller it's not a keyword */
        return FALSE;
    }
}